

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::CameraTransform_const&,float_const&,float_const&,pbrt::FilmHandle_const&,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&>
               (string *s,char *fmt,CameraTransform *v,float *args,float *args_1,FilmHandle *args_2,
               char **args_3,Vector3<float> *args_4,Vector3<float> *args_5,Vector3<float> *args_6,
               Vector3<float> *args_7)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char **in_RCX;
  FilmHandle *in_RDX;
  char *unaff_RBX;
  float *in_RSI;
  string *in_RDI;
  string *unaff_R14;
  Vector3<float> *in_stack_00000010;
  Vector3<float> *in_stack_00000018;
  Vector3<float> *in_stack_00000020;
  Vector3<float> *in_stack_00000028;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  CameraTransform *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd90;
  char **in_stack_fffffffffffffd98;
  char **in_stack_fffffffffffffda0;
  CameraTransform *in_stack_fffffffffffffda8;
  ostream *in_stack_fffffffffffffdb0;
  string local_248 [32];
  undefined8 local_228;
  string local_220 [32];
  stringstream local_200 [8];
  char *in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  LogLevel in_stack_fffffffffffffe24;
  string local_60 [48];
  
  copyToFormatString(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  lVar1 = std::__cxx11::string::find((char)local_60,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_60,0x73);
  lVar3 = std::__cxx11::string::find((char)local_60,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
             in_stack_fffffffffffffe08);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
             in_stack_fffffffffffffe08);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
               in_stack_fffffffffffffe08);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::CameraTransform_const&>(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd98);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_200);
    pbrt::operator<<(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    local_228 = std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    std::__cxx11::string::operator+=(in_RDI,local_220);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::stringstream::~stringstream(local_200);
  }
  stringPrintfRecursive<float_const&,float_const&,pbrt::FilmHandle_const&,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&>
            (unaff_R14,unaff_RBX,(float *)in_RDI,in_RSI,in_RDX,in_RCX,in_stack_00000010,
             in_stack_00000018,in_stack_00000020,in_stack_00000028);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}